

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void P_BringUpWeapon(player_t *player)

{
  double dVar1;
  APlayerPawn *ent;
  int iVar2;
  DPSprite *pDVar3;
  undefined4 extraout_var;
  AWeapon *pAVar4;
  AInventory *pAVar5;
  AWeapon *pAVar6;
  undefined4 extraout_var_00;
  TObjPtr<AWeapon> *obj;
  FSoundID local_24;
  
  pAVar6 = player->PendingWeapon;
  if (pAVar6 == (AWeapon *)0x0) {
    pAVar6 = (AWeapon *)0x0;
  }
  else {
    if (pAVar6 == (AWeapon *)0xffffffffffffffff) {
      if (player->ReadyWeapon == (AWeapon *)0x0) {
        return;
      }
      pDVar3 = player_t::GetPSprite(player,PSP_WEAPON);
      pDVar3->y = 32.375;
      iVar2 = (*(player->ReadyWeapon->super_AInventory).super_AActor.super_DThinker.super_DObject.
                _vptr_DObject[0x46])();
      P_SetPsprite(player,PSP_WEAPON,(FState *)CONCAT44(extraout_var,iVar2),false);
      return;
    }
    obj = &pAVar6->SisterWeapon;
    pAVar4 = GC::ReadBarrier<AWeapon>((AWeapon **)obj);
    if (((pAVar4 != (AWeapon *)0x0) &&
        (pAVar4 = GC::ReadBarrier<AWeapon>((AWeapon **)obj),
        ((pAVar4->super_AInventory).field_0x4dd & 4) != 0)) &&
       (pAVar5 = AActor::FindInventory
                           (&player->mo->super_AActor,
                            (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true),
       pAVar5 != (AInventory *)0x0)) {
      pAVar6 = GC::ReadBarrier<AWeapon>((AWeapon **)obj);
    }
  }
  player->PendingWeapon = (AWeapon *)0xffffffffffffffff;
  player->ReadyWeapon = pAVar6;
  ent = player->mo;
  (ent->super_AActor).weaponspecial = 0;
  if (pAVar6 != (AWeapon *)0x0) {
    iVar2 = (pAVar6->UpSound).super_FSoundID.ID;
    if (iVar2 != 0) {
      local_24.ID = iVar2;
      S_Sound(&ent->super_AActor,1,&local_24,1.0,1.0);
    }
    player->refire = 0;
    dVar1 = *(double *)(&DAT_006986a0 + (ulong)(((uint)player->cheats >> 0xb & 1) == 0) * 8);
    pDVar3 = player_t::GetPSprite(player,PSP_WEAPON);
    pDVar3->y = dVar1;
    P_SetPsprite(player,PSP_FLASH,(FState *)0x0,false);
    iVar2 = (*(pAVar6->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject
              [0x44])(pAVar6);
    P_SetPsprite(player,PSP_WEAPON,(FState *)CONCAT44(extraout_var_00,iVar2),false);
  }
  return;
}

Assistant:

void P_BringUpWeapon (player_t *player)
{
	AWeapon *weapon;

	if (player->PendingWeapon == WP_NOCHANGE)
	{
		if (player->ReadyWeapon != nullptr)
		{
			player->GetPSprite(PSP_WEAPON)->y = WEAPONTOP;
			P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetReadyState());
		}
		return;
	}

	weapon = player->PendingWeapon;

	// If the player has a tome of power, use this weapon's powered up
	// version, if one is available.
	if (weapon != nullptr &&
		weapon->SisterWeapon &&
		weapon->SisterWeapon->WeaponFlags & WIF_POWERED_UP &&
		player->mo->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true))
	{
		weapon = weapon->SisterWeapon;
	}

	player->PendingWeapon = WP_NOCHANGE;
	player->ReadyWeapon = weapon;
	player->mo->weaponspecial = 0;

	if (weapon != nullptr)
	{
		if (weapon->UpSound)
		{
			S_Sound (player->mo, CHAN_WEAPON, weapon->UpSound, 1, ATTN_NORM);
		}
		player->refire = 0;

		player->GetPSprite(PSP_WEAPON)->y = player->cheats & CF_INSTANTWEAPSWITCH
			? WEAPONTOP : WEAPONBOTTOM;
		// make sure that the previous weapon's flash state is terminated.
		// When coming here from a weapon drop it may still be active.
		P_SetPsprite(player, PSP_FLASH, nullptr);
		P_SetPsprite(player, PSP_WEAPON, weapon->GetUpState());
	}
}